

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O0

int fy_parse_input_open(fy_parser *fyp,fy_input *fyi)

{
  int iVar1;
  FILE *pFVar2;
  long lVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined1 local_b0 [4];
  int rc;
  stat sb;
  fy_input *fyi_local;
  fy_parser *fyp_local;
  
  if (fyi == (fy_input *)0x0) {
    return -1;
  }
  sb.__glibc_reserved[2] = (__syscall_slong_t)fyi;
  if (fyi->state != FYIS_QUEUED) {
    __assert_fail("fyi->state == FYIS_QUEUED",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                  ,0x13f,"int fy_parse_input_open(struct fy_parser *, struct fy_input *)");
  }
  fyi->buffer = (void *)0x0;
  fyi->allocated = 0;
  fyi->read = 0;
  fyi->chunk = 0;
  fyi->fp = (FILE *)0x0;
  switch((fyi->cfg).type) {
  case fyit_file:
    memset(&fyi->field_11,0,0x18);
    iVar1 = fy_path_open(fyp,*(char **)(sb.__glibc_reserved[2] + 0x28),(char **)0x0);
    *(int *)(sb.__glibc_reserved[2] + 0x78) = iVar1;
    if (*(int *)(sb.__glibc_reserved[2] + 0x78) == -1) {
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                     ,0x14d,"fy_parse_input_open","failed to open %s",
                     *(undefined8 *)(sb.__glibc_reserved[2] + 0x28));
    }
    else {
      iVar1 = fstat(*(int *)(sb.__glibc_reserved[2] + 0x78),(stat *)local_b0);
      if (iVar1 == -1) {
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                       ,0x151,"fy_parse_input_open","failed to fstat %s",
                       *(undefined8 *)(sb.__glibc_reserved[2] + 0x28));
      }
      else {
        *(__dev_t *)(sb.__glibc_reserved[2] + 0x88) = sb.st_rdev;
        if ((0 < (long)sb.st_rdev) &&
           (((fyp->cfg).flags & FYPCF_DISABLE_MMAP_OPT) == FYPCF_COLOR_AUTO)) {
          pvVar4 = mmap((void *)0x0,sb.st_rdev,1,2,*(int *)(sb.__glibc_reserved[2] + 0x78),0);
          *(void **)(sb.__glibc_reserved[2] + 0x80) = pvVar4;
          if (*(long *)(sb.__glibc_reserved[2] + 0x80) == -1) {
            *(undefined8 *)(sb.__glibc_reserved[2] + 0x80) = 0;
          }
        }
        if (*(long *)(sb.__glibc_reserved[2] + 0x80) != 0) goto LAB_00153150;
        uVar5 = *(undefined8 *)(sb.__glibc_reserved[2] + 0x28);
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                       ,0x163,"fy_parse_input_open",
                       "direct mmap mode unavailable for file %s, switching to stream mode",uVar5);
        pFVar2 = fdopen(*(int *)(sb.__glibc_reserved[2] + 0x78),"r");
        *(FILE **)(sb.__glibc_reserved[2] + 0x68) = pFVar2;
        if (iVar1 == -1) {
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                         ,0x167,"fy_parse_input_open","failed to fdopen %s",
                         *(undefined8 *)(sb.__glibc_reserved[2] + 0x28));
        }
        else {
          *(undefined4 *)(sb.__glibc_reserved[2] + 0x78) = 0xffffffff;
          lVar3 = sysconf(0x1e);
          *(long *)(sb.__glibc_reserved[2] + 0x60) = lVar3;
          pvVar4 = malloc(*(size_t *)(sb.__glibc_reserved[2] + 0x60));
          *(void **)(sb.__glibc_reserved[2] + 0x48) = pvVar4;
          if (*(long *)(sb.__glibc_reserved[2] + 0x48) != 0) {
            *(undefined8 *)(sb.__glibc_reserved[2] + 0x50) =
                 *(undefined8 *)(sb.__glibc_reserved[2] + 0x60);
            goto LAB_00153150;
          }
          fy_parser_diag(fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                         ,0x170,"fy_parse_input_open","fy_alloc() failed",uVar5);
        }
      }
    }
    break;
  case fyit_stream:
    memset(&fyi->field_11,0,0);
    *(undefined8 *)(sb.__glibc_reserved[2] + 0x60) = *(undefined8 *)(sb.__glibc_reserved[2] + 0x38);
    if (*(long *)(sb.__glibc_reserved[2] + 0x60) == 0) {
      lVar3 = sysconf(0x1e);
      *(long *)(sb.__glibc_reserved[2] + 0x60) = lVar3;
    }
    pvVar4 = malloc(*(size_t *)(sb.__glibc_reserved[2] + 0x60));
    *(void **)(sb.__glibc_reserved[2] + 0x48) = pvVar4;
    if (*(long *)(sb.__glibc_reserved[2] + 0x48) != 0) {
      *(undefined8 *)(sb.__glibc_reserved[2] + 0x50) =
           *(undefined8 *)(sb.__glibc_reserved[2] + 0x60);
      *(undefined8 *)(sb.__glibc_reserved[2] + 0x68) =
           *(undefined8 *)(sb.__glibc_reserved[2] + 0x30);
      goto LAB_00153150;
    }
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                   ,0x17b,"fy_parse_input_open","fy_alloc() failed");
    break;
  case fyit_memory:
    goto LAB_00153150;
  case fyit_alloc:
LAB_00153150:
    *(undefined4 *)(sb.__glibc_reserved[2] + 0x10) = 2;
    return 0;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                  ,0x189,"int fy_parse_input_open(struct fy_parser *, struct fy_input *)");
  }
  fy_input_close((fy_input *)sb.__glibc_reserved[2]);
  return -1;
}

Assistant:

int fy_parse_input_open(struct fy_parser *fyp, struct fy_input *fyi) {
    struct stat sb;
    int rc;

    if (!fyi)
        return -1;

    assert(fyi->state == FYIS_QUEUED);

    /* reset common data */
    fyi->buffer = NULL;
    fyi->allocated = 0;
    fyi->read = 0;
    fyi->chunk = 0;
    fyi->fp = NULL;

    switch (fyi->cfg.type) {
        case fyit_file:
            memset(&fyi->file, 0, sizeof(fyi->file));
            fyi->file.fd = fy_path_open(fyp, fyi->cfg.file.filename, NULL);
            fyp_error_check(fyp, fyi->file.fd != -1, err_out,
                            "failed to open %s", fyi->cfg.file.filename);

            rc = fstat(fyi->file.fd, &sb);
            fyp_error_check(fyp, rc != -1, err_out,
                            "failed to fstat %s", fyi->cfg.file.filename);

            fyi->file.length = sb.st_size;

            /* only map if not zero (and is not disabled) */
            if (sb.st_size > 0 && !(fyp->cfg.flags & FYPCF_DISABLE_MMAP_OPT)) {
                fyi->file.addr = mmap(NULL, sb.st_size, PROT_READ, MAP_PRIVATE,
                                      fyi->file.fd, 0);

                /* convert from MAP_FAILED to NULL */
                if (fyi->file.addr == MAP_FAILED)
                    fyi->file.addr = NULL;
            }
            /* if we've managed to mmap, we' good */
            if (fyi->file.addr)
                break;

            fyp_scan_debug(fyp, "direct mmap mode unavailable for file %s, switching to stream mode",
                           fyi->cfg.file.filename);

            fyi->fp = fdopen(fyi->file.fd, "r");
            fyp_error_check(fyp, rc != -1, err_out,
                            "failed to fdopen %s", fyi->cfg.file.filename);

            /* fd ownership assigned to file */
            fyi->file.fd = -1;

            /* switch to stream mode */
            fyi->chunk = sysconf(_SC_PAGESIZE);
            fyi->buffer = malloc(fyi->chunk);
            fyp_error_check(fyp, fyi->buffer, err_out,
                            "fy_alloc() failed");
            fyi->allocated = fyi->chunk;
            break;

        case fyit_stream:
            memset(&fyi->stream, 0, sizeof(fyi->stream));
            fyi->chunk = fyi->cfg.stream.chunk;
            if (!fyi->chunk)
                fyi->chunk = sysconf(_SC_PAGESIZE);
            fyi->buffer = malloc(fyi->chunk);
            fyp_error_check(fyp, fyi->buffer, err_out,
                            "fy_alloc() failed");
            fyi->allocated = fyi->chunk;
            fyi->fp = fyi->cfg.stream.fp;
            break;

        case fyit_memory:
            /* nothing to do for memory */
            break;

        case fyit_alloc:
            /* nothing to do for memory */
            break;

        default:
            assert(0);
            break;
    }

    fyi->state = FYIS_PARSE_IN_PROGRESS;

    return 0;

    err_out:
    fy_input_close(fyi);
    return -1;
}